

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O2

string * vkt::sparse::getShaderImageCoordinates
                   (string *__return_storage_ptr__,ImageType imageType,string *x,string *xy,
                   string *xyz)

{
  allocator<char> local_9;
  
  if (imageType < IMAGE_TYPE_LAST) {
    if (((0x78U >> (imageType & 0x1f) & 1) == 0) && (xyz = x, (6U >> (imageType & 0x1f) & 1) != 0))
    {
      xyz = xy;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)xyz);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_9)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderImageCoordinates	(const ImageType	imageType,
										 const std::string&	x,
										 const std::string&	xy,
										 const std::string&	xyz)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
			return x;

		case IMAGE_TYPE_1D_ARRAY:
		case IMAGE_TYPE_2D:
			return xy;

		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_3D:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return xyz;

		default:
			DE_ASSERT(0);
			return "";
	}
}